

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_deserialize_struct
          (t_go_generator *this,ostream *out,t_struct *tstruct,bool pointer_field,bool declare,
          string *prefix)

{
  char *pcVar1;
  ostream *poVar2;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  allocator local_51;
  string local_50 [8];
  string eq;
  string *prefix_local;
  bool declare_local;
  bool pointer_field_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  pcVar1 = " = ";
  if (declare) {
    pcVar1 = " := ";
  }
  eq.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  t_generator::indent_abi_cxx11_(&local_88,&this->super_t_generator);
  poVar2 = std::operator<<(out,(string *)&local_88);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,local_50);
  pcVar1 = "";
  if (pointer_field) {
    pcVar1 = "&";
  }
  std::operator<<(poVar2,pcVar1);
  std::__cxx11::string::~string((string *)&local_88);
  generate_go_struct_initializer(this,out,tstruct,false);
  t_generator::indent_abi_cxx11_(&local_a8,&this->super_t_generator);
  poVar2 = std::operator<<(out,(string *)&local_a8);
  poVar2 = std::operator<<(poVar2,"if err := ");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::operator<<(poVar2,(string *)&this->read_method_name_);
  poVar2 = std::operator<<(poVar2,"(ctx, iprot); err != nil {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a8);
  t_generator::indent_abi_cxx11_(&local_c8,&this->super_t_generator);
  poVar2 = std::operator<<(out,(string *)&local_c8);
  poVar2 = std::operator<<(poVar2,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T error reading struct: \", "
                          );
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"), err)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c8);
  t_generator::indent_abi_cxx11_(&local_e8,&this->super_t_generator);
  poVar2 = std::operator<<(out,(string *)&local_e8);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void t_go_generator::generate_deserialize_struct(ostream& out,
                                                 t_struct* tstruct,
                                                 bool pointer_field,
                                                 bool declare,
                                                 string prefix) {
  string eq(declare ? " := " : " = ");

  out << indent() << prefix << eq << (pointer_field ? "&" : "");
  generate_go_struct_initializer(out, tstruct);
  out << indent() << "if err := " << prefix << "." << read_method_name_ <<  "(ctx, iprot); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T error reading struct: \", "
      << prefix << "), err)" << endl;
  out << indent() << "}" << endl;
}